

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::is_other(Twine *Path,bool *Result)

{
  bool bVar1;
  error_code eVar2;
  undefined1 local_70 [8];
  file_status FileStatus;
  bool *Result_local;
  Twine *Path_local;
  error_code EC;
  
  FileStatus.fs_st_ino = (ino_t)Result;
  file_status::file_status((file_status *)local_70);
  eVar2 = status(Path,(file_status *)local_70,true);
  EC._0_8_ = eVar2._M_cat;
  Path_local._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&Path_local);
  if (!bVar1) {
    bVar1 = is_other((basic_file_status *)local_70);
    *(bool *)FileStatus.fs_st_ino = bVar1;
    std::error_code::error_code((error_code *)&Path_local);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)Path_local;
  eVar2._M_cat = (error_category *)EC._0_8_;
  return eVar2;
}

Assistant:

std::error_code is_other(const Twine &Path, bool &Result) {
  file_status FileStatus;
  if (std::error_code EC = status(Path, FileStatus))
    return EC;
  Result = is_other(FileStatus);
  return std::error_code();
}